

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall
wabt::SharedValidator::OnGlobalGet(SharedValidator *this,Location *loc,Var *global_var)

{
  Result rhs;
  Var local_80;
  Enum local_34;
  GlobalType local_30;
  GlobalType global_type;
  Var *global_var_local;
  Location *loc_local;
  SharedValidator *this_local;
  Result result;
  
  global_type = (GlobalType)global_var;
  Result::Result((Result *)((long)&this_local + 4),Ok);
  this->expr_loc_ = loc;
  GlobalType::GlobalType(&local_30);
  Var::Var(&local_80,global_var);
  local_34 = (Enum)CheckGlobalIndex(this,&local_80,&local_30);
  Result::operator|=((Result *)((long)&this_local + 4),(Result)local_34);
  Var::~Var(&local_80);
  rhs = TypeChecker::OnGlobalGet(&this->typechecker_,local_30.type);
  Result::operator|=((Result *)((long)&this_local + 4),rhs);
  return (Result)this_local._4_4_;
}

Assistant:

Result SharedValidator::OnGlobalGet(const Location& loc, Var global_var) {
  Result result = Result::Ok;
  expr_loc_ = &loc;
  GlobalType global_type;
  result |= CheckGlobalIndex(global_var, &global_type);
  result |= typechecker_.OnGlobalGet(global_type.type);
  return result;
}